

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Mat local_60;
  
  local_60.dims = bottom_blob->dims;
  if (local_60.dims != 3) {
LAB_0010b8b0:
    iVar4 = Convolution::forward(&this->super_Convolution,bottom_blob,top_blob);
    return iVar4;
  }
  iVar4 = (this->super_Convolution).kernel_w;
  if (iVar4 != (this->super_Convolution).kernel_h) goto LAB_0010b8b0;
  iVar1 = (this->super_Convolution).stride_w;
  if ((((iVar1 != (this->super_Convolution).stride_h) || (5 < iVar1 || 5 < iVar4)) ||
      (iVar8 = (this->super_Convolution).dilation_w, iVar8 != (this->super_Convolution).dilation_h))
     || (pcVar2 = (code *)(&PTR_forward_inplace_0013b8b0)[(long)iVar4 * 5 + (long)iVar1],
        pcVar2 == (code *)0x0)) goto LAB_0010b8b0;
  if (iVar8 != 1) {
    iVar4 = (*(this->super_Convolution).super_Layer._vptr_Layer[8])
                      (this,bottom_blob,top_blob,pcVar2);
    return iVar4;
  }
  iVar8 = bottom_blob->w;
  iVar6 = bottom_blob->h;
  local_60.data = bottom_blob->data;
  local_60.refcount = bottom_blob->refcount;
  local_60.elemsize = bottom_blob->elemsize;
  if (local_60.refcount != (int *)0x0) {
    LOCK();
    *local_60.refcount = *local_60.refcount + 1;
    UNLOCK();
  }
  local_60.w = bottom_blob->w;
  local_60.h = bottom_blob->h;
  local_60.c = bottom_blob->c;
  local_60.cstep = bottom_blob->cstep;
  iVar5 = (this->super_Convolution).pad_w;
  if ((iVar5 < 1) && (iVar7 = (this->super_Convolution).pad_h, iVar7 < 1)) {
    if (iVar7 == -0xe9 && iVar5 == -0xe9) {
      iVar7 = ~((iVar8 + -1) % iVar1) + iVar4;
      iVar5 = ~((iVar6 + -1) % iVar1) + iVar4;
      if ((iVar7 < 1) && (iVar5 < 1)) {
LAB_0010b97f:
        bVar3 = true;
        iVar8 = local_60.w;
        iVar6 = local_60.h;
      }
      else {
        copy_make_border(bottom_blob,&local_60,iVar5 / 2,iVar5 - iVar5 / 2,iVar7 / 2,
                         iVar7 - iVar7 / 2,0,0.0);
        if (local_60.data == (void *)0x0) {
          bVar3 = false;
        }
        else {
          if ((long)local_60.c * local_60.cstep != 0) goto LAB_0010b97f;
          bVar3 = false;
        }
      }
      iVar5 = -100;
      if (!bVar3) goto LAB_0010b894;
    }
  }
  else {
    iVar8 = (this->super_Convolution).pad_h;
    copy_make_border(bottom_blob,&local_60,iVar8,iVar8,iVar5,iVar5,0,0.0);
    iVar5 = -100;
    if ((local_60.data == (void *)0x0) || ((long)local_60.c * local_60.cstep == 0))
    goto LAB_0010b894;
    iVar8 = local_60.w;
    iVar6 = local_60.h;
  }
  Mat::create(top_blob,(iVar8 - iVar4) / iVar1 + 1,(iVar6 - iVar4) / iVar1 + 1,
              (this->super_Convolution).num_output,4);
  iVar5 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar5 = 0;
    (*pcVar2)(&local_60,top_blob,&(this->super_Convolution).weight_data,
              &(this->super_Convolution).bias_data);
  }
LAB_0010b894:
  Mat::~Mat(&local_60);
  return iVar5;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob);
    }

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Convolution::forward(bottom_blob, top_blob);
    }

    const int kernel_size = kernel_w;
    const int stride = stride_w;

    if (kernel_size > 5 || stride > 5 || dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob);
    }

    typedef void (*conv_func)(const Mat&, Mat&, const Mat&, const Mat&);

    // kernel_size x stride
    conv_func conv_func_table[5][5] =
    {
        {
            conv1x1s1_sse,
            conv1x1s2_sse,
            0,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_sse,
            0,
            0,
            0,
            0
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {
            conv5x5s1_sse,
            0,
            0,
            0,
            0
        }  // kernel_size = 5
    };

    conv_func conv = conv_func_table[kernel_size-1][stride-1];
    if (!conv)
    {
        return Convolution::forward(bottom_blob, top_blob);
    }

    if (dilation_w != 1) {
        return forwardDilation(bottom_blob, top_blob, conv);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_size + (w - 1) / stride * stride - w;
        int hpad = kernel_size + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_size) / stride + 1;
    int outh = (h - kernel_size) / stride + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    conv(bottom_blob_bordered, top_blob, weight_data, bias_data);

    return 0;
}